

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_ab3c04::Target::DumpCommandFragment
          (Value *__return_storage_ptr__,Target *this,
          JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *frag,string *role)

{
  Value *pVVar1;
  ulong uVar2;
  Value local_90;
  Value local_58;
  undefined1 local_29;
  string *local_28;
  string *role_local;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *frag_local;
  Target *this_local;
  Value *fragment;
  
  local_29 = 0;
  local_28 = role;
  role_local = &frag->Value;
  frag_local = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_58,role_local);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"fragment");
  Json::Value::operator=(pVVar1,&local_58);
  Json::Value::~Value(&local_58);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Json::Value::Value(&local_90,local_28);
    pVVar1 = Json::Value::operator[](__return_storage_ptr__,"role");
    Json::Value::operator=(pVVar1,&local_90);
    Json::Value::~Value(&local_90);
  }
  AddBacktrace(this,__return_storage_ptr__,(JBTIndex)*(ArrayIndex *)(role_local + 1));
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpCommandFragment(JBT<std::string> const& frag,
                                        std::string const& role)
{
  Json::Value fragment = Json::objectValue;
  fragment["fragment"] = frag.Value;
  if (!role.empty()) {
    fragment["role"] = role;
  }
  this->AddBacktrace(fragment, frag.Backtrace);
  return fragment;
}